

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Document::ReadPropertyTemplates(Document *this)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *p_Var1;
  const_iterator cVar2;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var3;
  long *plVar4;
  mapped_type *pmVar5;
  size_type *psVar6;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var7;
  _Base_ptr extraout_RDX;
  _Base_ptr extraout_RDX_00;
  long lVar8;
  Element *pEVar9;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  shared_ptr<const_Assimp::FBX::PropertyTable> props;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_d0;
  string local_b0;
  key_type local_90;
  PropertyTable *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  long *local_60 [2];
  long local_50 [2];
  _Base_ptr local_40;
  Document *local_38;
  
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
            *)(this->parser->root)._M_t.
              super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
              _M_t.
              super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
              .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Definitions","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(p_Var1,&local_d0);
  if (cVar2._M_node == &(p_Var1->_M_impl).super__Rb_tree_header._M_header) {
    lVar8 = 0;
  }
  else {
    lVar8 = *(long *)(cVar2._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((lVar8 == 0) ||
     (p_Var1 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                 **)(lVar8 + 0x20),
     p_Var1 == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                *)0x0)) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"no Definitions dictionary found","");
    Util::DOMWarning(&local_d0,(Element *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ObjectType","");
    pVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             ::equal_range(p_Var1,&local_d0);
    _Var7 = pVar10.second._M_node;
    local_40 = _Var7._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      _Var7._M_node = extraout_RDX;
    }
    auVar12._8_8_ = _Var7._M_node;
    auVar12._0_8_ = pVar10.first._M_node._M_node;
    if (pVar10.first._M_node._M_node != local_40) {
      local_38 = (Document *)&local_38->templates;
      do {
        pEVar9 = *(Element **)(auVar12._0_8_ + 2);
        p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                  *)(pEVar9->compound)._M_t.
                    super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
                    .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
        if (p_Var1 == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                       *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"expected nested scope in ObjectType, ignoring","");
          Util::DOMWarning(&local_d0,pEVar9);
        }
        else if ((pEVar9->tokens).
                 super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 (pEVar9->tokens).
                 super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"expected name for ObjectType element, ignoring","");
          Util::DOMWarning(&local_d0,pEVar9);
        }
        else {
          ParseTokenAsString_abi_cxx11_
                    (&local_d0,
                     (FBX *)*(pEVar9->tokens).
                             super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,auVar12._8_8_);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"PropertyTemplate","")
          ;
          pVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                   ::equal_range(p_Var1,&local_b0);
          _Var3 = pVar10.first._M_node;
          _Var7._M_node = pVar10.second._M_node._M_node;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            _Var7._M_node = extraout_RDX_00;
          }
          auVar11._8_8_ = _Var7._M_node;
          auVar11._0_8_ = _Var3._M_node;
          while (_Var3._M_node != pVar10.second._M_node._M_node) {
            pEVar9 = *(Element **)(auVar11._0_8_ + 2);
            p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                      *)(pEVar9->compound)._M_t.
                        super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
                        .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
            if (p_Var1 == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                           *)0x0) {
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b0,"expected nested scope in PropertyTemplate, ignoring",
                         "");
              Util::DOMWarning(&local_b0,pEVar9);
            }
            else if ((pEVar9->tokens).
                     super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_start ==
                     (pEVar9->tokens).
                     super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b0,"expected name for PropertyTemplate element, ignoring",
                         "");
              Util::DOMWarning(&local_b0,pEVar9);
            }
            else {
              ParseTokenAsString_abi_cxx11_
                        (&local_b0,
                         (FBX *)*(pEVar9->tokens).
                                 super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,auVar11._8_8_);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Properties70","")
              ;
              cVar2 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                      ::find(p_Var1,&local_90);
              if ((_Rb_tree_header *)cVar2._M_node == &(p_Var1->_M_impl).super__Rb_tree_header) {
                pEVar9 = (Element *)0x0;
              }
              else {
                pEVar9 = *(Element **)(cVar2._M_node + 2);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if (pEVar9 != (Element *)0x0) {
                local_90._M_dataplus._M_p = (pointer)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<Assimp::FBX::PropertyTable_const*>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length,
                           (PropertyTable *)0x0);
                local_70 = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<Assimp::FBX::PropertyTable_const,std::allocator<Assimp::FBX::PropertyTable>,Assimp::FBX::Element_const&,std::shared_ptr<Assimp::FBX::PropertyTable_const>>
                          (&local_68,&local_70,(allocator<Assimp::FBX::PropertyTable> *)local_60,
                           pEVar9,(shared_ptr<const_Assimp::FBX::PropertyTable> *)&local_90);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_90._M_string_length);
                }
                local_60[0] = local_50;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_60,local_d0._M_dataplus._M_p,
                           local_d0._M_dataplus._M_p + local_d0._M_string_length);
                std::__cxx11::string::append((char *)local_60);
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)local_60,(ulong)local_b0._M_dataplus._M_p);
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                psVar6 = (size_type *)(plVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar4 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar6) {
                  local_90.field_2._M_allocated_capacity = *psVar6;
                  local_90.field_2._8_8_ = plVar4[3];
                }
                else {
                  local_90.field_2._M_allocated_capacity = *psVar6;
                  local_90._M_dataplus._M_p = (pointer)*plVar4;
                }
                local_90._M_string_length = plVar4[1];
                *plVar4 = (long)psVar6;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
                                       *)local_38,&local_90);
                (pmVar5->
                super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr = local_70;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&(pmVar5->
                            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>
                            )._M_refcount,&local_68);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                if (local_60[0] != local_50) {
                  operator_delete(local_60[0],local_50[0] + 1);
                }
                if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            auVar11 = std::_Rb_tree_increment(auVar11._0_8_);
            _Var3._M_node = auVar11._0_8_;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        auVar12 = std::_Rb_tree_increment(auVar12._0_8_);
      } while (auVar12._0_8_ != local_40);
    }
  }
  return;
}

Assistant:

void Document::ReadPropertyTemplates()
{
    const Scope& sc = parser.GetRootScope();
    // read property templates from "Definitions" section
    const Element* const edefs = sc["Definitions"];
    if(!edefs || !edefs->Compound()) {
        DOMWarning("no Definitions dictionary found");
        return;
    }

    const Scope& sdefs = *edefs->Compound();
    const ElementCollection otypes = sdefs.GetCollection("ObjectType");
    for(ElementMap::const_iterator it = otypes.first; it != otypes.second; ++it) {
        const Element& el = *(*it).second;
        const Scope* sc = el.Compound();
        if(!sc) {
            DOMWarning("expected nested scope in ObjectType, ignoring",&el);
            continue;
        }

        const TokenList& tok = el.Tokens();
        if(tok.empty()) {
            DOMWarning("expected name for ObjectType element, ignoring",&el);
            continue;
        }

        const std::string& oname = ParseTokenAsString(*tok[0]);

        const ElementCollection templs = sc->GetCollection("PropertyTemplate");
        for(ElementMap::const_iterator it = templs.first; it != templs.second; ++it) {
            const Element& el = *(*it).second;
            const Scope* sc = el.Compound();
            if(!sc) {
                DOMWarning("expected nested scope in PropertyTemplate, ignoring",&el);
                continue;
            }

            const TokenList& tok = el.Tokens();
            if(tok.empty()) {
                DOMWarning("expected name for PropertyTemplate element, ignoring",&el);
                continue;
            }

            const std::string& pname = ParseTokenAsString(*tok[0]);

            const Element* Properties70 = (*sc)["Properties70"];
            if(Properties70) {
                std::shared_ptr<const PropertyTable> props = std::make_shared<const PropertyTable>(
                    *Properties70,std::shared_ptr<const PropertyTable>(static_cast<const PropertyTable*>(NULL))
                );

                templates[oname+"."+pname] = props;
            }
        }
    }
}